

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CCallExpression::Copy(CCallExpression *this)

{
  CCallExpression *this_00;
  long in_RSI;
  CExpressionList local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20 [2];
  CCallExpression *this_local;
  
  this_local = this;
  this_00 = (CCallExpression *)operator_new(0x18);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  operator->((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
              *)(in_RSI + 8));
  CNameExpression::CopyCast
            ((CNameExpression *)
             &local_40.expressions.
              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  operator->((unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
              *)(in_RSI + 0x10));
  CExpressionList::Copy(&local_40);
  CCallExpression(this_00,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                           *)&local_40.expressions.
                              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                   *)&local_40);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             this,local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (local_20);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr((unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
               *)&local_40);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
               *)&local_40.expressions.
                  super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CCallExpression::Copy( ) const {
    return std::move(
            std::unique_ptr<const IRT::CExpression>( new CCallExpression( function->CopyCast( ), arguments->Copy( ))));
}